

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<ProKey,_QSet<ProKey>_> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_>::findNode<ProKey>
          (Data<QHashPrivate::Node<ProKey,_QSet<ProKey>_>_> *this,ProKey *key)

{
  size_t sVar1;
  ulong uVar2;
  Node<ProKey,_QSet<ProKey>_> *pNVar3;
  Bucket BVar4;
  
  uVar2 = this->seed;
  sVar1 = qHash(&key->super_ProString);
  BVar4 = findBucketWithHash<ProKey>(this,key,uVar2 ^ sVar1);
  uVar2 = (ulong)(BVar4.span)->offsets[BVar4.index];
  if (uVar2 == 0xff) {
    pNVar3 = (Node<ProKey,_QSet<ProKey>_> *)0x0;
  }
  else {
    pNVar3 = (Node<ProKey,_QSet<ProKey>_> *)((BVar4.span)->entries + uVar2);
  }
  return pNVar3;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }